

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::Grammar::AddProductions
          (Grammar *this,
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          *prodList)

{
  bool bVar1;
  reference pvVar2;
  reference prod_00;
  Production *prod;
  iterator __end3;
  iterator __begin3;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  *__range3;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  *prodList_local;
  Grammar *this_local;
  
  bVar1 = std::
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          ::empty(prodList);
  if (!bVar1) {
    if (this->ProductionCount == 0) {
      pvVar2 = std::
               vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
               ::operator[](prodList,0);
      CreateAcceptingProductions(this,pvVar2->Left);
    }
    __end3 = std::
             vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
             ::begin(prodList);
    prod = (Production *)
           std::
           vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
           ::end(prodList);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<SGParser::Generator::Production_*,_std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>_>
                                       *)&prod), bVar1) {
      prod_00 = __gnu_cxx::
                __normal_iterator<SGParser::Generator::Production_*,_std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>_>
                ::operator*(&__end3);
      AddProductionImpl(this,prod_00);
      __gnu_cxx::
      __normal_iterator<SGParser::Generator::Production_*,_std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void Grammar::AddProductions(std::vector<Production>& prodList) {
    if (!prodList.empty()) {
        if (!ProductionCount)
            CreateAcceptingProductions(prodList[0].Left);

        for (auto& prod: prodList)
            AddProductionImpl(prod);
    }
}